

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall re2::Prog::ComputeByteMap(Prog *this)

{
  byte bVar1;
  char cVar2;
  Inst *pIVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  undefined8 extraout_RAX;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  ulong in_RCX;
  int iVar10;
  uint uVar11;
  int foldlo;
  uint uVar12;
  int iVar13;
  int foldhi;
  long lVar14;
  ByteMapBuilder builder;
  uint local_4b4;
  uint local_4b0;
  char local_4aa [2];
  ulong local_4a8;
  ulong local_4a0;
  Prog *local_498;
  long local_490;
  undefined1 local_488 [1088];
  pointer ppStack_48;
  pointer local_40;
  pointer ppStack_38;
  
  local_488._0_8_ = 0;
  local_488._8_8_ = 0;
  local_488._16_8_ = 0;
  local_488._1064_8_ = (pointer)0x0;
  local_488._1072_8_ = (pointer)0x0;
  local_488._1080_8_ = (pointer)0x0;
  ppStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  ppStack_38 = (pointer)0x0;
  local_488._24_8_ = 0x8000000000000000;
  local_488._1052_4_ = 0x100;
  local_488._1056_4_ = 0x101;
  if (0 < this->size_) {
    lVar14 = 0;
    local_4a0 = 0;
    local_4a8 = 0;
    local_498 = this;
    do {
      pIVar3 = (local_498->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      uVar6 = pIVar3[lVar14].out_opcode_ & 7;
      local_490 = lVar14;
      if (uVar6 == 4) {
        uVar6 = pIVar3[lVar14].field_1.out1_;
        in_RCX = in_RCX & 0xffffffffffffff00;
        if ((uVar6 & 3) != 0 && (local_4a0 & 1) == 0) {
          local_4b0 = 10;
          local_4b4 = 10;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&ppStack_48,
                     (int *)&local_4b0,(int *)&local_4b4);
          ByteMapBuilder::Merge((ByteMapBuilder *)local_488);
          uVar6 = pIVar3[lVar14].field_1.out1_;
          in_RCX = CONCAT71((int7)(in_RCX >> 8),1);
          local_4a0 = in_RCX;
        }
        if ((uVar6 & 0x30) != 0 && (local_4a8 & 1) == 0) {
          local_4aa[0] = '\x01';
          local_4aa[1] = '\0';
          lVar14 = 0;
          do {
            cVar2 = local_4aa[lVar14];
            uVar6 = 0;
            do {
              bVar7 = (byte)uVar6;
              bVar8 = (bVar7 == 0x5f || (byte)(uVar6 - 0x30) < 10) ||
                      (byte)((bVar7 & 0xdf) + 0xbf) < 0x1a;
              in_RCX = (ulong)CONCAT31((int3)(uVar6 - 0x30 >> 8),bVar8);
              uVar11 = 0xff;
              if (0xff < (int)uVar6) {
                uVar11 = uVar6;
              }
              uVar12 = uVar11 + 1;
              iVar10 = -1;
              iVar13 = 0;
              do {
                if ((uVar6 - uVar11) + iVar13 == 0) goto LAB_001d42c5;
                cVar5 = (char)iVar10;
                cVar4 = bVar7 + (char)iVar13;
                iVar13 = iVar13 + 1;
                iVar10 = iVar10 + 1;
              } while (bVar8 == (((byte)(bVar7 + cVar5) == ']' || (byte)(cVar4 - 0x2fU) < 10) ||
                                (byte)((cVar4 + 1U & 0xdf) + 0xbf) < 0x1a));
              uVar11 = iVar10 + uVar6;
              uVar12 = iVar13 + uVar6;
LAB_001d42c5:
              if ((bool)cVar2 == bVar8) {
                uVar9 = uVar11 ^ 0xff | uVar6;
                in_RCX = (ulong)uVar9;
                local_4b4 = uVar11;
                local_4b0 = uVar6;
                if (uVar9 != 0) {
                  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                  emplace_back<int&,int&>
                            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                             &ppStack_48,(int *)&local_4b0,(int *)&local_4b4);
                }
              }
              uVar6 = uVar12;
            } while ((int)uVar11 < 0xff);
            ByteMapBuilder::Merge((ByteMapBuilder *)local_488);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 2);
          local_4a8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
      }
      else if (uVar6 == 2) {
        bVar7 = pIVar3[lVar14].field_1.field_3.lo_;
        bVar1 = pIVar3[lVar14].field_1.field_3.hi_;
        uVar11 = (uint)bVar1;
        local_4b0 = (uint)bVar7;
        uVar6 = (uint)bVar1;
        local_4b4 = uVar6;
        if ((local_4b0 != 0) || (bVar1 != 0xff)) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&ppStack_48,
                     (int *)&local_4b0,(int *)&local_4b4);
        }
        lVar14 = local_490;
        if (((0x60 < bVar1) && (bVar7 < 0x7b)) &&
           ((pIVar3[local_490].field_1.field_3.hint_foldcase_ & 1) != 0)) {
          uVar12 = (uint)bVar7;
          if (bVar7 < 0x62) {
            uVar12 = 0x61;
          }
          if (0x79 < uVar6) {
            uVar11 = 0x7a;
          }
          if (uVar12 <= uVar11) {
            local_4b0 = uVar12 - 0x20;
            local_4b4 = uVar11 - 0x20;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<int&,int&>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&ppStack_48,
                       (int *)&local_4b0,(int *)&local_4b4);
          }
        }
        if ((pIVar3[lVar14].out_opcode_ & 8) == 0) {
          uVar6 = (local_498->inst_).ptr_._M_t.
                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                  .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl[lVar14 + 1].
                  out_opcode_;
          in_RCX = (ulong)uVar6;
          if (((uVar6 & 7) == 2) &&
             (uVar6 = uVar6 ^ pIVar3[lVar14].out_opcode_, in_RCX = (ulong)uVar6, uVar6 < 0x10))
          goto LAB_001d431e;
        }
        ByteMapBuilder::Merge((ByteMapBuilder *)local_488);
      }
LAB_001d431e:
      lVar14 = local_490 + 1;
      this = local_498;
    } while (lVar14 < local_498->size_);
  }
  ByteMapBuilder::Build((ByteMapBuilder *)local_488,this->bytemap_,&this->bytemap_range_);
  if (ppStack_48 != (pointer)0x0) {
    operator_delete(ppStack_48);
  }
  if ((pointer)local_488._1064_8_ != (pointer)0x0) {
    operator_delete((void *)local_488._1064_8_);
  }
  return;
}

Assistant:

void Prog::ComputeByteMap() {
  // Fill in bytemap with byte classes for the program.
  // Ranges of bytes that are treated indistinguishably
  // will be mapped to a single byte class.
  ByteMapBuilder builder;

  // Don't repeat the work for ^ and $.
  bool marked_line_boundaries = false;
  // Don't repeat the work for \b and \B.
  bool marked_word_boundaries = false;

  for (int id = 0; id < size(); id++) {
    Inst* ip = inst(id);
    if (ip->opcode() == kInstByteRange) {
      int lo = ip->lo();
      int hi = ip->hi();
      builder.Mark(lo, hi);
      if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
        int foldlo = lo;
        int foldhi = hi;
        if (foldlo < 'a')
          foldlo = 'a';
        if (foldhi > 'z')
          foldhi = 'z';
        if (foldlo <= foldhi) {
          foldlo += 'A' - 'a';
          foldhi += 'A' - 'a';
          builder.Mark(foldlo, foldhi);
        }
      }
      // If this Inst is not the last Inst in its list AND the next Inst is
      // also a ByteRange AND the Insts have the same out, defer the merge.
      if (!ip->last() &&
          inst(id+1)->opcode() == kInstByteRange &&
          ip->out() == inst(id+1)->out())
        continue;
      builder.Merge();
    } else if (ip->opcode() == kInstEmptyWidth) {
      if (ip->empty() & (kEmptyBeginLine|kEmptyEndLine) &&
          !marked_line_boundaries) {
        builder.Mark('\n', '\n');
        builder.Merge();
        marked_line_boundaries = true;
      }
      if (ip->empty() & (kEmptyWordBoundary|kEmptyNonWordBoundary) &&
          !marked_word_boundaries) {
        // We require two batches here: the first for ranges that are word
        // characters, the second for ranges that are not word characters.
        for (bool isword : {true, false}) {
          int j;
          for (int i = 0; i < 256; i = j) {
            for (j = i + 1; j < 256 &&
                            Prog::IsWordChar(static_cast<uint8_t>(i)) ==
                                Prog::IsWordChar(static_cast<uint8_t>(j));
                 j++)
              ;
            if (Prog::IsWordChar(static_cast<uint8_t>(i)) == isword)
              builder.Mark(i, j - 1);
          }
          builder.Merge();
        }
        marked_word_boundaries = true;
      }
    }
  }

  builder.Build(bytemap_, &bytemap_range_);

  if (0) {  // For debugging, use trivial bytemap.
    LOG(ERROR) << "Using trivial bytemap.";
    for (int i = 0; i < 256; i++)
      bytemap_[i] = static_cast<uint8_t>(i);
    bytemap_range_ = 256;
  }
}